

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

void slang::ast::anon_unknown_39::unwrapResult
               (Scope *scope,optional<slang::SourceRange> range,LookupResult *result,
               bool unwrapGenericClasses)

{
  byte bVar1;
  SymbolKind SVar2;
  GenericClassDefSymbol *this;
  _Storage<slang::SourceRange,_true> range_00;
  bool bVar3;
  Symbol *curr;
  DeclaredType *pDVar4;
  Type *pTVar5;
  Diagnostic *pDVar6;
  Symbol *pSVar7;
  Symbol *curr_2;
  Symbol *pSVar8;
  Scope *pSVar9;
  GenericClassDefSymbol *genericClass;
  
  if (result->found != (Symbol *)0x0) {
    range_00 = range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::SourceRange>._M_payload;
    if (((((result->flags).m_bits & 2) == 0) ||
        (pDVar4 = Symbol::getDeclaredType(result->found), pDVar4 == (DeclaredType *)0x0)) ||
       ((pDVar4->field_0x3f & 0x40) == 0)) {
      checkVisibility(result->found,scope,range,result);
      pSVar7 = result->found;
      if (pSVar7->kind == TypeAlias) {
        Compilation::noteReference(scope->compilation,pSVar7,false);
      }
      else if (pSVar7->kind == TypeParameter) {
        Compilation::noteReference(scope->compilation,pSVar7,false);
        result->found = (Symbol *)result->found[2].parentScope;
        (result->flags).m_bits = (result->flags).m_bits | 8;
      }
      this = (GenericClassDefSymbol *)result->found;
      if (unwrapGenericClasses && (this->super_Symbol).kind == GenericClassDef) {
        pTVar5 = GenericClassDefSymbol::getDefaultSpecialization(this,scope);
        result->found = &pTVar5->super_Symbol;
        if (pTVar5 == (Type *)0x0) {
          if (range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::SourceRange>._M_engaged != true) {
            return;
          }
          pDVar6 = Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0x1b000a,
                                    range_00._M_value);
          Diagnostic::operator<<(pDVar6,(this->super_Symbol).name);
          return;
        }
      }
      if (range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
        bVar1 = (result->flags).m_bits;
        if ((bVar1 & 1) == 0) {
          if ((bVar1 & 2) == 0) {
            pSVar9 = result->found->parentScope;
            if ((pSVar9 != (Scope *)0x0) && (pSVar9->thisSym->kind == CompilationUnit)) {
              for (pSVar7 = scope->thisSym; pSVar7->kind != InstanceBody;
                  pSVar7 = pSVar7->parentScope->thisSym) {
                if (pSVar7->kind == Package) {
                  pDVar6 = Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0x4000a,
                                            range_00._M_value);
                  Diagnostic::addNote(pDVar6,(DiagCode)0x50001,result->found->location);
                  return;
                }
                if (pSVar7->parentScope == (Scope *)0x0) {
                  return;
                }
              }
            }
          }
          else {
            for (pSVar7 = scope->thisSym; pSVar7->kind != InstanceBody;
                pSVar7 = pSVar7->parentScope->thisSym) {
              if (pSVar7->kind == Package) goto LAB_00880123;
              if (pSVar7->parentScope == (Scope *)0x0) break;
            }
            pSVar7 = (Symbol *)0x0;
LAB_00880123:
            if (pSVar7 != (Symbol *)0x0) {
              for (pSVar8 = result->found; pSVar8->kind != InstanceBody;
                  pSVar8 = pSVar8->parentScope->thisSym) {
                if (pSVar8->kind == Package) goto LAB_0088014b;
                if (pSVar8->parentScope == (Scope *)0x0) break;
              }
              pSVar8 = (Symbol *)0x0;
LAB_0088014b:
              if (pSVar8 != pSVar7) {
                Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0xb000a,
                                 range_00._M_value);
                return;
              }
            }
          }
        }
        else {
          pSVar9 = result->found->parentScope;
          do {
            if (pSVar9 == (Scope *)0x0) {
              return;
            }
            SVar2 = pSVar9->thisSym->kind;
            if (SVar2 == Package) {
LAB_0088008c:
              bVar3 = false;
            }
            else {
              if (SVar2 == AnonymousProgram) {
                for (pSVar7 = scope->thisSym; pSVar7->kind != AnonymousProgram;
                    pSVar7 = pSVar7->parentScope->thisSym) {
                  if (pSVar7->kind == InstanceBody) {
                    if (*(int *)(pSVar7[2].name._M_str + 0x48) != 2) {
LAB_00880065:
                      pDVar6 = Diagnostics::add(&result->diagnostics,scope->thisSym,
                                                (DiagCode)0xf000a,range_00._M_value);
                      Diagnostic::addNote(pDVar6,(DiagCode)0x50001,result->found->location);
                    }
                    break;
                  }
                  if (pSVar7->parentScope == (Scope *)0x0) goto LAB_00880065;
                }
                goto LAB_0088008c;
              }
              pSVar9 = pSVar9->thisSym->parentScope;
              bVar3 = true;
            }
          } while (bVar3);
        }
      }
    }
    else {
      if (range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
        pDVar6 = Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0x29000a,
                                  range_00._M_value);
        Diagnostic::operator<<(pDVar6,result->found->name);
        Diagnostic::addNote(pDVar6,(DiagCode)0x50001,result->found->location);
      }
      result->found = (Symbol *)0x0;
    }
  }
  return;
}

Assistant:

void unwrapResult(const Scope& scope, std::optional<SourceRange> range, LookupResult& result,
                  bool unwrapGenericClasses = true) {
    if (!result.found)
        return;

    if (result.flags.has(LookupResultFlags::IsHierarchical)) {
        auto declaredType = result.found->getDeclaredType();
        if (declaredType && declaredType->isEvaluating()) {
            if (range) {
                auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *range);
                diag << result.found->name;
                diag.addNote(diag::NoteDeclarationHere, result.found->location);
            }
            result.found = nullptr;
            return;
        }
    }

    checkVisibility(*result.found, scope, range, result);

    // Unwrap type parameters into their target type alias.
    if (result.found->kind == SymbolKind::TypeParameter) {
        scope.getCompilation().noteReference(*result.found);

        result.found = &result.found->as<TypeParameterSymbol>().getTypeAlias();
        result.flags |= LookupResultFlags::FromTypeParam;
    }
    else if (result.found->kind == SymbolKind::TypeAlias) {
        scope.getCompilation().noteReference(*result.found);
    }

    // If the found symbol is a generic class, unwrap into
    // the default specialization (if possible).
    if (result.found->kind == SymbolKind::GenericClassDef && unwrapGenericClasses) {
        auto& genericClass = result.found->as<GenericClassDefSymbol>();
        result.found = genericClass.getDefaultSpecialization(scope);

        if (!result.found) {
            if (range)
                result.addDiag(scope, diag::NoDefaultSpecialization, *range) << genericClass.name;
            return;
        }
    }

    if (!range)
        return;

    if (result.flags.has(LookupResultFlags::WasImported)) {
        // If the symbol was imported from a package, check if it is actually
        // declared within an anonymous program within that package and if so,
        // check whether we're allowed to reference it from our source scope.
        auto parent = result.found->getParentScope();
        while (parent) {
            auto& parentSym = parent->asSymbol();
            if (parentSym.kind == SymbolKind::Package)
                break;

            if (parentSym.kind == SymbolKind::AnonymousProgram) {
                if (!isInProgram(scope.asSymbol())) {
                    auto& diag = result.addDiag(scope, diag::IllegalReferenceToProgramItem, *range);
                    diag.addNote(diag::NoteDeclarationHere, result.found->location);
                }
                break;
            }

            parent = parentSym.getParentScope();
        }
    }
    else if (result.flags.has(LookupResultFlags::IsHierarchical)) {
        // Hierarchical references are not allowed from within packages
        // unless the target symbol is also within the same package.
        auto pkg = getContainingPackage(scope.asSymbol());
        if (pkg && getContainingPackage(*result.found) != pkg)
            result.addDiag(scope, diag::HierarchicalFromPackage, *range);
    }
    else if (auto parent = result.found->getParentScope();
             parent && parent->asSymbol().kind == SymbolKind::CompilationUnit) {
        // Compilation unit items are not allowed to be referenced from a package.
        if (getContainingPackage(scope.asSymbol())) {
            auto& diag = result.addDiag(scope, diag::CompilationUnitFromPackage, *range);
            diag.addNote(diag::NoteDeclarationHere, result.found->location);
        }
    }
}